

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O0

uint __thiscall cppcms::http::request::server_port(request *this)

{
  uint uVar1;
  char *__nptr;
  long in_RDI;
  
  cppcms::impl::cgi::connection::getenv_abi_cxx11_
            ((connection *)&stack0xffffffffffffffd8,*(char **)(in_RDI + 200));
  __nptr = (char *)std::__cxx11::string::c_str();
  uVar1 = atoi(__nptr);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  return uVar1;
}

Assistant:

unsigned request::server_port() { return atoi(conn_->getenv("SERVER_PORT").c_str()); }